

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O0

int nn_xsub_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  nn_sockbase *local_48;
  nn_xsub *xsub;
  int rc;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sockbase *self_local;
  
  local_48 = self;
  if (self == (nn_sockbase *)0x0) {
    local_48 = (nn_sockbase *)0x0;
  }
  if (level == 0x21) {
    if (option == 1) {
      self_local._4_4_ =
           nn_trie_subscribe((nn_trie *)&local_48[0x19].sock,(uint8_t *)optval,optvallen);
      if (-1 < self_local._4_4_) {
        self_local._4_4_ = 0;
      }
    }
    else if (option == 2) {
      self_local._4_4_ =
           nn_trie_unsubscribe((nn_trie *)&local_48[0x19].sock,(uint8_t *)optval,optvallen);
      if (-1 < self_local._4_4_) {
        self_local._4_4_ = 0;
      }
    }
    else {
      self_local._4_4_ = -0x5c;
    }
  }
  else {
    self_local._4_4_ = -0x5c;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_xsub_setopt (struct nn_sockbase *self, int level, int option,
        const void *optval, size_t optvallen)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    if (level != NN_SUB)
        return -ENOPROTOOPT;

    if (option == NN_SUB_SUBSCRIBE) {
        rc = nn_trie_subscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    if (option == NN_SUB_UNSUBSCRIBE) {
        rc = nn_trie_unsubscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    return -ENOPROTOOPT;
}